

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

void __thiscall helics::CommonCore::processExecRequest(CommonCore *this,ActionMessage *cmd)

{
  GlobalFederateId federateID;
  int iVar1;
  BaseTimeCoordinator *pBVar2;
  string_view message;
  bool bVar3;
  int iVar4;
  mapped_type *this_00;
  GlobalFederateId *dep;
  pointer pGVar5;
  string_view name;
  _Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> local_40;
  
  bVar3 = isLocal(this,(GlobalFederateId)(cmd->source_id).gid);
  if (bVar3) {
    federateID.gid = (cmd->source_id).gid;
    bVar3 = hasTimeBlock(this,federateID);
    if (bVar3) {
      local_40._M_impl.super__Vector_impl_data._M_start._0_4_ = federateID.gid;
      this_00 = std::
                map<int,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>_>_>
                ::operator[](&this->delayedTimingMessages,(key_type *)&local_40);
      std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::push_back
                (this_00,cmd);
      return;
    }
  }
  iVar4 = (this->super_BrokerBase).global_broker_id_local.gid;
  iVar1 = (cmd->dest_id).gid;
  if (iVar1 == iVar4) {
    pBVar2 = (this->super_BrokerBase).timeCoord._M_t.
             super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
             ._M_t.
             super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
             .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
    (*pBVar2->_vptr_BaseTimeCoordinator[3])(pBVar2,cmd);
    if ((this->super_BrokerBase).enteredExecutionMode == false) {
      pBVar2 = (this->super_BrokerBase).timeCoord._M_t.
               super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
               .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
      iVar4 = (*pBVar2->_vptr_BaseTimeCoordinator[9])(pBVar2,0x8831d580);
      if ((char)iVar4 != '\0') {
        (*((this->super_BrokerBase).timeCoord._M_t.
           super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
           ._M_t.
           super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
           .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl)->
          _vptr_BaseTimeCoordinator[2])();
        return;
      }
      (this->super_BrokerBase).enteredExecutionMode = true;
      if (0xe < (this->super_BrokerBase).maxLogLevel.super___atomic_base<int>._M_i) {
        message._M_str = "entering Exec Mode";
        message._M_len = 0x12;
        name._M_str = (this->super_BrokerBase).identifier._M_dataplus._M_p;
        name._M_len = (this->super_BrokerBase).identifier._M_string_length;
        BrokerBase::sendToLogger
                  (&this->super_BrokerBase,
                   (GlobalFederateId)(this->super_BrokerBase).global_broker_id_local.gid,0xf,name,
                   message,false);
      }
    }
  }
  else {
    if (((iVar1 != -1700000000) && (iVar1 != -2010000000)) || ((cmd->source_id).gid != iVar4)) {
      routeMessage(this,cmd);
      return;
    }
    BaseTimeCoordinator::getDependents
              ((vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> *)
               &local_40,
               (this->super_BrokerBase).timeCoord._M_t.
               super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
               .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl);
    for (pGVar5 = (pointer)CONCAT44(local_40._M_impl.super__Vector_impl_data._M_start._4_4_,
                                    local_40._M_impl.super__Vector_impl_data._M_start._0_4_);
        pGVar5 != local_40._M_impl.super__Vector_impl_data._M_finish; pGVar5 = pGVar5 + 1) {
      routeMessage(this,cmd,(GlobalFederateId)pGVar5->gid);
    }
    std::_Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>::
    ~_Vector_base(&local_40);
  }
  return;
}

Assistant:

void CommonCore::processExecRequest(ActionMessage& cmd)
{
    if (isLocal(GlobalBrokerId{cmd.source_id})) {
        if (hasTimeBlock(cmd.source_id)) {
            delayedTimingMessages[cmd.source_id.baseValue()].push_back(cmd);
            return;
        }
    }
    if (cmd.dest_id == global_broker_id_local) {
        timeCoord->processTimeMessage(cmd);
        if (!enteredExecutionMode) {
            auto res = timeCoord->checkExecEntry();
            if (res == MessageProcessingResult::NEXT_STEP) {
                enteredExecutionMode = true;
                LOG_TIMING(global_broker_id_local, getIdentifier(), "entering Exec Mode");
            } else {
                timeCoord->updateTimeFactors();
            }
        }
    } else if (!cmd.dest_id.isValid() && cmd.source_id == global_broker_id_local) {
        for (auto& dep : timeCoord->getDependents()) {
            routeMessage(cmd, dep);
        }
    } else {
        routeMessage(cmd);
    }
}